

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O2

void generate_const_func<unsigned_short>(void)

{
  ostream *poVar1;
  char param_name [2];
  ushort local_2a;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_2a = 0x76;
  poVar1 = std::operator<<((ostream *)&std::cout,"LIBDIVIDE_INLINE constexpr ");
  poVar1 = std::operator<<(poVar1,"libdivide_u16_t");
  poVar1 = std::operator<<(poVar1," get_divider_");
  poVar1 = std::operator<<(poVar1,"u16");
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,"uint16_t");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(char *)&local_2a);
  poVar1 = std::operator<<(poVar1,") {\n");
  std::operator<<(poVar1,"\treturn\n");
  local_28._8_8_ = 0;
  local_28._2_6_ = 0;
  local_28._0_2_ = local_2a;
  local_10 = std::
             _Function_handler<void_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ridiculousfish[P]libdivide/test/fast_div_generator.cpp:107:22)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ridiculousfish[P]libdivide/test/fast_div_generator.cpp:107:22)>
             ::_M_manager;
  generator<unsigned_short>((function<void_(unsigned_short)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t");
  poVar1 = std::operator<<(poVar1,"libdivide_u16_t");
  poVar1 = std::operator<<(poVar1," { 0, 0 }; // Unreachable\n");
  std::operator<<(poVar1,"}");
  return;
}

Assistant:

void generate_const_func() {
    const char param_name[] = "v";
    std::cout << "LIBDIVIDE_INLINE constexpr " << struct_selector<_IntT>::get_name()
                << " get_divider_" << type_tag<_IntT>::get_tag() 
                << "(" << type_name<_IntT>::get_name() << " " << param_name << ") {\n"
                << "\treturn\n";
    generator<_IntT>([param_name](_IntT denom) { 
            std::cout << "\t";
            generate_ternary_primary<_IntT>(denom, param_name); 
            });
    std:: cout  << "\t" << struct_selector<_IntT>::get_name() << " { 0, 0 }; // Unreachable\n"
                << "}";
}